

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

uint64_t ReadCompactSize<ParamsStream<BufferedFile&,TransactionSerParams>>
                   (ParamsStream<BufferedFile_&,_TransactionSerParams> *is,bool range_check)

{
  long lVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *pcVar6;
  byte in_SIL;
  long in_FS_OFFSET;
  uint64_t nSizeRet;
  uint8_t chSize;
  io_errc in_stack_ffffffffffffff24;
  error_code *in_stack_ffffffffffffff28;
  ParamsStream<BufferedFile_&,_TransactionSerParams> *in_stack_ffffffffffffff30;
  ulong local_60;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ser_readdata8<ParamsStream<BufferedFile&,TransactionSerParams>>(in_stack_ffffffffffffff30)
  ;
  if (bVar2 < 0xfd) {
    local_60 = (ulong)bVar2;
  }
  else if (bVar2 == 0xfd) {
    uVar3 = ser_readdata16<ParamsStream<BufferedFile&,TransactionSerParams>>
                      (in_stack_ffffffffffffff30);
    local_60 = (ulong)uVar3;
    if (local_60 < 0xfd) {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      std::error_code::error_code<std::io_errc,void>
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"non-canonical ReadCompactSize()");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_008446a8;
    }
  }
  else if (bVar2 == 0xfe) {
    uVar4 = ser_readdata32<ParamsStream<BufferedFile&,TransactionSerParams>>
                      (in_stack_ffffffffffffff30);
    local_60 = (ulong)uVar4;
    if (local_60 < 0x10000) {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      std::error_code::error_code<std::io_errc,void>
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"non-canonical ReadCompactSize()");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_008446a8;
    }
  }
  else {
    local_60 = ser_readdata64<ParamsStream<BufferedFile&,TransactionSerParams>>
                         (in_stack_ffffffffffffff30);
    if (local_60 < 0x100000000) {
      pcVar5 = (char *)__cxa_allocate_exception(0x20);
      std::error_code::error_code<std::io_errc,void>
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar5,(error_code *)"non-canonical ReadCompactSize()");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_008446a8;
    }
  }
  if (((in_SIL & 1) == 0) || (local_60 < 0x2000001)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return local_60;
    }
  }
  else {
    pcVar6 = (char *)__cxa_allocate_exception(0x20);
    pcVar5 = pcVar6;
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar6,(error_code *)"ReadCompactSize(): size too large");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar5,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_008446a8:
  __stack_chk_fail();
}

Assistant:

uint64_t ReadCompactSize(Stream& is, bool range_check = true)
{
    uint8_t chSize = ser_readdata8(is);
    uint64_t nSizeRet = 0;
    if (chSize < 253)
    {
        nSizeRet = chSize;
    }
    else if (chSize == 253)
    {
        nSizeRet = ser_readdata16(is);
        if (nSizeRet < 253)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else if (chSize == 254)
    {
        nSizeRet = ser_readdata32(is);
        if (nSizeRet < 0x10000u)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    else
    {
        nSizeRet = ser_readdata64(is);
        if (nSizeRet < 0x100000000ULL)
            throw std::ios_base::failure("non-canonical ReadCompactSize()");
    }
    if (range_check && nSizeRet > MAX_SIZE) {
        throw std::ios_base::failure("ReadCompactSize(): size too large");
    }
    return nSizeRet;
}